

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O1

void putRGBUAcontig16bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  ushort uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint32_t uVar5;
  uint16_t *wp;
  
  if (h != 0) {
    uVar2 = img->samplesperpixel;
    do {
      if (w != 0) {
        puVar3 = img->UaToAa;
        puVar4 = img->Bitdepth16To8;
        uVar5 = w;
        do {
          bVar1 = puVar4[*(ushort *)((long)pp + 6)];
          *cp = (uint)bVar1 << 0x18 |
                (uint)puVar3[(ulong)puVar4[*(ushort *)pp] + (ulong)bVar1 * 0x100] |
                (uint)puVar3[(ulong)puVar4[*(ushort *)((long)pp + 2)] + (ulong)bVar1 * 0x100] << 8 |
                (uint)puVar3[(ulong)puVar4[*(ushort *)((long)pp + 4)] + (ulong)bVar1 * 0x100] <<
                0x10;
          cp = cp + 1;
          pp = (uchar *)((long)pp + (ulong)((uint)uVar2 * 2));
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      cp = cp + toskew;
      pp = (uchar *)((long)pp + (long)fromskew * (ulong)uVar2 * 2);
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putRGBUAcontig16bittile)
{
    int samplesperpixel = img->samplesperpixel;
    uint16_t *wp = (uint16_t *)pp;
    (void)y;
    fromskew *= samplesperpixel;
    for (; h > 0; --h)
    {
        uint32_t r, g, b, a;
        uint8_t *m;
        for (x = w; x > 0; --x)
        {
            a = img->Bitdepth16To8[wp[3]];
            m = img->UaToAa + ((size_t)a << 8);
            r = m[img->Bitdepth16To8[wp[0]]];
            g = m[img->Bitdepth16To8[wp[1]]];
            b = m[img->Bitdepth16To8[wp[2]]];
            *cp++ = PACK4(r, g, b, a);
            wp += samplesperpixel;
        }
        cp += toskew;
        wp += fromskew;
    }
}